

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void __thiscall google::protobuf::io::Tokenizer::ConsumeString(Tokenizer *this,char delimiter)

{
  char cVar1;
  bool bVar2;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  char local_11;
  Tokenizer *pTStack_10;
  char delimiter_local;
  Tokenizer *this_local;
  
  local_11 = delimiter;
  pTStack_10 = this;
  while( true ) {
    while( true ) {
      cVar1 = this->current_char_;
      if (cVar1 == '\0') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_38,"Unexpected end of string.",&local_39);
        AddError(this,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator((allocator<char> *)&local_39);
        return;
      }
      if (cVar1 == '\n') break;
      if (cVar1 == '\\') {
        NextChar(this);
        bVar2 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::Escape>(this);
        if ((!bVar2) &&
           (bVar2 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::OctalDigit>(this),
           !bVar2)) {
          bVar2 = TryConsume(this,'x');
          if (bVar2) {
            bVar2 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>(this);
            if (!bVar2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_98,"Expected hex digits for escape sequence.",&local_99);
              AddError(this,&local_98);
              std::__cxx11::string::~string((string *)&local_98);
              std::allocator<char>::~allocator((allocator<char> *)&local_99);
            }
          }
          else {
            bVar2 = TryConsume(this,'u');
            if (bVar2) {
              bVar2 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>(this);
              if ((((!bVar2) ||
                   (bVar2 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>
                                      (this), !bVar2)) ||
                  (bVar2 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>
                                     (this), !bVar2)) ||
                 (bVar2 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>(this)
                 , !bVar2)) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_c0,"Expected four hex digits for \\u escape sequence.",
                           &local_c1);
                AddError(this,&local_c0);
                std::__cxx11::string::~string((string *)&local_c0);
                std::allocator<char>::~allocator((allocator<char> *)&local_c1);
              }
            }
            else {
              bVar2 = TryConsume(this,'U');
              if (bVar2) {
                bVar2 = TryConsume(this,'0');
                if (((((!bVar2) || (bVar2 = TryConsume(this,'0'), !bVar2)) ||
                     ((bVar2 = TryConsume(this,'0'), !bVar2 &&
                      (bVar2 = TryConsume(this,'1'), !bVar2)))) ||
                    ((bVar2 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>
                                        (this), !bVar2 ||
                     (bVar2 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>
                                        (this), !bVar2)))) ||
                   ((bVar2 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>
                                       (this), !bVar2 ||
                    ((bVar2 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>
                                        (this), !bVar2 ||
                     (bVar2 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::HexDigit>
                                        (this), !bVar2)))))) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_e8,
                             "Expected eight hex digits up to 10ffff for \\U escape sequence",
                             &local_e9);
                  AddError(this,&local_e8);
                  std::__cxx11::string::~string((string *)&local_e8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_110,"Invalid escape sequence in string literal.",
                           &local_111);
                AddError(this,&local_110);
                std::__cxx11::string::~string((string *)&local_110);
                std::allocator<char>::~allocator((allocator<char> *)&local_111);
              }
            }
          }
        }
      }
      else {
        if (this->current_char_ == local_11) {
          NextChar(this);
          return;
        }
        NextChar(this);
      }
    }
    if ((this->allow_multiline_strings_ & 1U) == 0) break;
    NextChar(this);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,"String literals cannot cross line boundaries.",&local_71);
  AddError(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return;
}

Assistant:

void Tokenizer::ConsumeString(char delimiter) {
  while (true) {
    switch (current_char_) {
      case '\0':
        AddError("Unexpected end of string.");
        return;

      case '\n': {
        if (!allow_multiline_strings_) {
          AddError("String literals cannot cross line boundaries.");
          return;
        }
        NextChar();
        break;
      }

      case '\\': {
        // An escape sequence.
        NextChar();
        if (TryConsumeOne<Escape>()) {
          // Valid escape sequence.
        } else if (TryConsumeOne<OctalDigit>()) {
          // Possibly followed by two more octal digits, but these will
          // just be consumed by the main loop anyway so we don't need
          // to do so explicitly here.
        } else if (TryConsume('x')) {
          if (!TryConsumeOne<HexDigit>()) {
            AddError("Expected hex digits for escape sequence.");
          }
          // Possibly followed by another hex digit, but again we don't care.
        } else if (TryConsume('u')) {
          if (!TryConsumeOne<HexDigit>() || !TryConsumeOne<HexDigit>() ||
              !TryConsumeOne<HexDigit>() || !TryConsumeOne<HexDigit>()) {
            AddError("Expected four hex digits for \\u escape sequence.");
          }
        } else if (TryConsume('U')) {
          // We expect 8 hex digits; but only the range up to 0x10ffff is
          // legal.
          if (!TryConsume('0') || !TryConsume('0') ||
              !(TryConsume('0') || TryConsume('1')) ||
              !TryConsumeOne<HexDigit>() || !TryConsumeOne<HexDigit>() ||
              !TryConsumeOne<HexDigit>() || !TryConsumeOne<HexDigit>() ||
              !TryConsumeOne<HexDigit>()) {
            AddError(
                "Expected eight hex digits up to 10ffff for \\U escape "
                "sequence");
          }
        } else {
          AddError("Invalid escape sequence in string literal.");
        }
        break;
      }

      default: {
        if (current_char_ == delimiter) {
          NextChar();
          return;
        }
        NextChar();
        break;
      }
    }
  }
}